

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O2

void __thiscall
wavingz::encoder<signed_char>::encoder
          (encoder<signed_char> *this,size_t sample_rate,size_t baud_rate,double A)

{
  runtime_error *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_98;
  
  this->A = A;
  (this->convert_iq).A_m = A;
  this->sample_rate = sample_rate;
  this->baud_rate = baud_rate;
  this->Ts = sample_rate / baud_rate;
  auVar3._8_4_ = (int)(sample_rate >> 0x20);
  auVar3._0_8_ = sample_rate;
  auVar3._12_4_ = 0x45300000;
  dVar1 = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sample_rate) - 4503599627370496.0);
  butter_lp<6>(&local_98,dVar1,125000.0);
  iir_filter<6>::iir_filter(&this->lp1,&local_98);
  butter_lp<6>(&local_98,dVar1,125000.0);
  iir_filter<6>::iir_filter(&this->lp2,&local_98);
  auVar4._0_8_ = (double)CONCAT44(0x43300000,(int)this->Ts);
  auVar4._8_4_ = (int)(this->Ts >> 0x20);
  auVar4._12_4_ = 0x45300000;
  dVar2 = sin((((auVar4._8_8_ - 1.9342813113834067e+25) + (auVar4._0_8_ - 4503599627370496.0)) *
              62831.853071795864) / dVar1);
  auVar5._0_8_ = (double)CONCAT44(0x43300000,(int)this->Ts);
  auVar5._8_4_ = (int)(this->Ts >> 0x20);
  auVar5._12_4_ = 0x45300000;
  dVar1 = sin((((auVar5._8_8_ - 1.9342813113834067e+25) + (auVar5._0_8_ - 4503599627370496.0)) *
              314159.26535897935) / dVar1);
  if (ABS(dVar2 - dVar1) <= 1e-12) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "Please choose sample_rate and baud_rate so that the resulting phase will be coherent with the (1/2) separation frequency (20KHz)."
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

encoder(size_t sample_rate, size_t baud_rate, double A = 100.0)
        : A(A)
        , sample_rate(sample_rate)
        , baud_rate(baud_rate), Ts(sample_rate / baud_rate)
        , lp1(butter_lp<6>(sample_rate, f1_mul * dfreq * 2.5))
        , lp2(butter_lp<6>(sample_rate, f1_mul * dfreq * 2.5))

    {
        if (std::abs(sin(2.0 * M_PI * dfreq * f0_mul * (double)Ts / sample_rate) -
                     sin(2.0 * M_PI * dfreq * f1_mul * (double)Ts / sample_rate)) > 1e-12)
        {
            throw std::runtime_error(
                "Please choose sample_rate and baud_rate so "
                "that the resulting phase will be coherent "
                "with the (1/2) separation frequency (20KHz).");
        }
    }